

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::CallNative(SQVM *this,SQNativeClosure *nclosure,SQInteger nargs,SQInteger newbase,
                SQObjectPtr *retval,SQInt32 target,bool *suspend,bool *tailcall)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  uint uVar4;
  uint uVar5;
  SQObjectType SVar6;
  CallInfo *pCVar7;
  SQTable *pSVar8;
  SQObjectPtr *pSVar9;
  long *plVar10;
  SQWeakRef *pSVar11;
  bool bVar12;
  SQInteger SVar13;
  long lVar14;
  char *s;
  SQUnsignedInteger nparam;
  SQObjectPtr *pSVar15;
  long lVar16;
  SQUnsignedInteger SVar17;
  
  if (this->_nnativecalls < 100) {
    lVar14 = nclosure->_nparamscheck;
    if ((lVar14 == 0) ||
       ((lVar14 < 1 || lVar14 == nargs && ((-nargs == lVar14 || -lVar14 < nargs) || -1 < lVar14))))
    {
      SVar17 = (nclosure->_typecheck)._size;
      if (SVar17 != 0) {
        if (nargs < (long)SVar17) {
          SVar17 = nargs;
        }
        if (0 < (long)SVar17) {
          pSVar15 = (this->_stack)._vals + newbase;
          nparam = 0;
          do {
            lVar14 = (nclosure->_typecheck)._vals[nparam];
            if ((lVar14 != -1) &&
               (SVar3 = (pSVar15->super_SQObject)._type, ((SQObjectType)lVar14 & SVar3) == 0)) {
              Raise_ParamTypeError(this,nparam,lVar14,(ulong)SVar3);
              return false;
            }
            nparam = nparam + 1;
            pSVar15 = pSVar15 + 1;
          } while (SVar17 != nparam);
        }
      }
      bVar12 = EnterFrame(this,newbase,nargs + newbase + nclosure->_noutervalues,false);
      if (!bVar12) {
        return false;
      }
      pCVar7 = this->ci;
      pSVar8 = (pCVar7->_closure).super_SQObject._unVal.pTable;
      SVar3 = (pCVar7->_closure).super_SQObject._type;
      (pCVar7->_closure).super_SQObject._type = OT_NATIVECLOSURE;
      (pCVar7->_closure).super_SQObject._unVal.pNativeClosure = nclosure;
      pSVar1 = &(nclosure->super_SQCollectable).super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      this->ci->_target = target;
      SVar17 = nclosure->_noutervalues;
      if (0 < (long)SVar17) {
        lVar16 = nargs * 0x10 + newbase * 0x10;
        lVar14 = 8;
        do {
          pSVar15 = nclosure->_outervalues;
          pSVar9 = (this->_stack)._vals;
          uVar4 = *(uint *)((long)pSVar9 + lVar14 + -8 + lVar16);
          plVar10 = *(long **)((long)&pSVar9[newbase + nargs].super_SQObject._type + lVar14);
          *(undefined8 *)((long)&pSVar9[newbase + nargs].super_SQObject._type + lVar14) =
               *(undefined8 *)((long)&(pSVar15->super_SQObject)._type + lVar14);
          uVar5 = *(uint *)((long)pSVar15 + lVar14 + -8);
          *(uint *)((long)pSVar9 + lVar14 + -8 + lVar16) = uVar5;
          if ((uVar5 >> 0x1b & 1) != 0) {
            plVar2 = (long *)(*(long *)((long)&pSVar9[newbase + nargs].super_SQObject._type + lVar14
                                       ) + 8);
            *plVar2 = *plVar2 + 1;
          }
          if ((uVar4 >> 0x1b & 1) != 0) {
            plVar2 = plVar10 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar10 + 0x10))();
            }
          }
          lVar14 = lVar14 + 0x10;
          SVar17 = SVar17 - 1;
        } while (SVar17 != 0);
      }
      pSVar11 = nclosure->_env;
      if (pSVar11 != (SQWeakRef *)0x0) {
        pSVar15 = (this->_stack)._vals;
        SVar3 = pSVar15[newbase].super_SQObject._type;
        pSVar8 = pSVar15[newbase].super_SQObject._unVal.pTable;
        pSVar15[newbase].super_SQObject._unVal = (pSVar11->_obj)._unVal;
        SVar6 = (pSVar11->_obj)._type;
        pSVar15[newbase].super_SQObject._type = SVar6;
        if ((SVar6 >> 0x1b & 1) != 0) {
          pSVar1 = &((pSVar15[newbase].super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar3 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
      }
      this->_nnativecalls = this->_nnativecalls + 1;
      SVar13 = (*nclosure->_function)(this);
      this->_nnativecalls = this->_nnativecalls + -1;
      *suspend = false;
      *tailcall = false;
      if (SVar13 == -0x29a) {
        *suspend = true;
      }
      else {
        if (SVar13 == -0x309) {
          *tailcall = true;
          return true;
        }
        if (SVar13 < 0) {
          LeaveFrame(this);
          Raise_Error(this,&this->_lasterror);
          return false;
        }
      }
      if (SVar13 == 0) {
        pSVar8 = (retval->super_SQObject)._unVal.pTable;
        SVar3 = (retval->super_SQObject)._type;
        (retval->super_SQObject)._type = OT_NULL;
        (retval->super_SQObject)._unVal.pTable = (SQTable *)0x0;
      }
      else {
        pSVar15 = (this->_stack)._vals;
        lVar14 = this->_top;
        SVar3 = (retval->super_SQObject)._type;
        pSVar8 = (retval->super_SQObject)._unVal.pTable;
        (retval->super_SQObject)._unVal = pSVar15[lVar14 + -1].super_SQObject._unVal;
        SVar6 = pSVar15[lVar14 + -1].super_SQObject._type;
        (retval->super_SQObject)._type = SVar6;
        if ((SVar6 >> 0x1b & 1) != 0) {
          pSVar1 = &(((retval->super_SQObject)._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
      }
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      LeaveFrame(this);
      return true;
    }
    s = "wrong number of parameters";
  }
  else {
    s = "Native stack overflow";
  }
  Raise_Error(this,s);
  return false;
}

Assistant:

bool SQVM::CallNative(SQNativeClosure *nclosure, SQInteger nargs, SQInteger newbase, SQObjectPtr &retval, SQInt32 target,bool &suspend, bool &tailcall)
{
    SQInteger nparamscheck = nclosure->_nparamscheck;
    SQInteger newtop = newbase + nargs + nclosure->_noutervalues;

    if (_nnativecalls + 1 > MAX_NATIVE_CALLS) {
        Raise_Error(_SC("Native stack overflow"));
        return false;
    }

    if(nparamscheck && (((nparamscheck > 0) && (nparamscheck != nargs)) ||
        ((nparamscheck < 0) && (nargs < (-nparamscheck)))))
    {
        Raise_Error(_SC("wrong number of parameters"));
        return false;
    }

    SQInteger tcs;
    SQIntVec &tc = nclosure->_typecheck;
    if((tcs = tc.size())) {
        for(SQInteger i = 0; i < nargs && i < tcs; i++) {
            if((tc._vals[i] != -1) && !(sq_type(_stack._vals[newbase+i]) & tc._vals[i])) {
                Raise_ParamTypeError(i,tc._vals[i], sq_type(_stack._vals[newbase+i]));
                return false;
            }
        }
    }

    if(!EnterFrame(newbase, newtop, false)) return false;
    ci->_closure  = nclosure;
	ci->_target = target;

    SQInteger outers = nclosure->_noutervalues;
    for (SQInteger i = 0; i < outers; i++) {
        _stack._vals[newbase+nargs+i] = nclosure->_outervalues[i];
    }
    if(nclosure->_env) {
        _stack._vals[newbase] = nclosure->_env->_obj;
    }

    _nnativecalls++;
    SQInteger ret = (nclosure->_function)(this);
    _nnativecalls--;

    suspend = false;
	tailcall = false;
	if (ret == SQ_TAILCALL_FLAG) {
		tailcall = true;
		return true;
	}
    else if (ret == SQ_SUSPEND_FLAG) {
        suspend = true;
    }
    else if (ret < 0) {
        LeaveFrame();
        Raise_Error(_lasterror);
        return false;
    }
    if(ret) {
        retval = _stack._vals[_top-1];
    }
    else {
        retval.Null();
    }
    //retval = ret ? _stack._vals[_top-1] : _null_;
    LeaveFrame();
    return true;
}